

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O3

ReadFileResult
anon_unknown.dwarf_dfbf64::TestPresetOutputTruncationHelper
          (optional<cmCTestTypes::TruncationMode> *out,Value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  _Optional_payload_base<cmCTestTypes::TruncationMode> _Var4;
  ReadFileResult RVar5;
  String local_50;
  
  if (value == (Value *)0x0) {
    RVar5 = READ_OK;
    if ((out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
        super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged == true) {
      (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
      super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged = false;
    }
  }
  else {
    bVar2 = Json::Value::isString(value);
    RVar5 = INVALID_PRESET;
    if (bVar2) {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      paVar1 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        _Var4._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x0;
        _Var4._M_engaged = true;
        _Var4._5_3_ = 0;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          _Var4._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x1;
          _Var4._M_engaged = true;
          _Var4._5_3_ = 0;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_50,value);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar3 != 0) {
            return INVALID_PRESET;
          }
          _Var4._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x2;
          _Var4._M_engaged = true;
          _Var4._5_3_ = 0;
        }
      }
      (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
      super__Optional_payload_base<cmCTestTypes::TruncationMode> = _Var4;
      RVar5 = READ_OK;
    }
  }
  return RVar5;
}

Assistant:

ReadFileResult TestPresetOutputTruncationHelper(
  cm::optional<cmCTestTypes::TruncationMode>& out, const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "tail") {
    out = cmCTestTypes::TruncationMode::Tail;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "middle") {
    out = cmCTestTypes::TruncationMode::Middle;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "head") {
    out = cmCTestTypes::TruncationMode::Head;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}